

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int encode_array_constructor
              (AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,_Bool use_smallest)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  _Bool use_smallest_local;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  
  if (use_smallest) {
    iVar1 = output_byte(encoder_output,context,0xe0);
    if (iVar1 == 0) {
      l._0_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"encode_array_constructor",0x1043,1,"Could not encode small array constructor");
      }
      l._0_4_ = 0x1044;
    }
  }
  else {
    iVar1 = output_byte(encoder_output,context,0xf0);
    if (iVar1 == 0) {
      l._0_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"encode_array_constructor",0x1052,1,"Could not encode large array constructor");
      }
      l._0_4_ = 0x1053;
    }
  }
  return (int)l;
}

Assistant:

static int encode_array_constructor(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, bool use_smallest)
{
    int result;

    if (use_smallest)
    {
        /* Codes_SRS_AMQPVALUE_01_306: [<encoding name="map8" code="0xE0" category="compound" width="1" label="up to 2^8 - 1 octets of encoded map data"/>] */
        if (output_byte(encoder_output, context, 0xE0) != 0)
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Could not encode small array constructor");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_307: [<encoding name="map32" code="0xF0" category="compound" width="4" label="up to 2^32 - 1 octets of encoded map data"/>] */
        if (output_byte(encoder_output, context, 0xF0) != 0)
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Could not encode large array constructor");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }

    return result;
}